

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

xmlRegexpPtr xmlRegexpCompile(xmlChar *regexp)

{
  xmlRegParserCtxtPtr ctxt;
  xmlRegStatePtr pxVar1;
  xmlRegexpPtr pxVar2;
  
  ctxt = xmlRegNewParserCtxt(regexp);
  if (ctxt == (xmlRegParserCtxtPtr)0x0) {
    return (xmlRegexpPtr)0x0;
  }
  ctxt->end = (xmlRegStatePtr)0x0;
  pxVar1 = xmlRegNewState(ctxt);
  ctxt->state = pxVar1;
  ctxt->start = pxVar1;
  xmlRegStatePush(ctxt,pxVar1);
  xmlFAParseRegExp(ctxt,1);
  if (*ctxt->cur != '\0') {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"xmlFAParseRegExp: extra characters");
  }
  if (ctxt->error == 0) {
    pxVar1 = ctxt->state;
    ctxt->end = pxVar1;
    ctxt->start->type = XML_REGEXP_START_STATE;
    pxVar1->type = XML_REGEXP_FINAL_STATE;
    xmlFAEliminateEpsilonTransitions(ctxt);
    if (ctxt->error == 0) {
      pxVar2 = xmlRegEpxFromParse(ctxt);
      goto LAB_0019b920;
    }
  }
  pxVar2 = (xmlRegexpPtr)0x0;
LAB_0019b920:
  xmlRegFreeParserCtxt(ctxt);
  return pxVar2;
}

Assistant:

xmlRegexpPtr
xmlRegexpCompile(const xmlChar *regexp) {
    xmlRegexpPtr ret;
    xmlRegParserCtxtPtr ctxt;

    ctxt = xmlRegNewParserCtxt(regexp);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->end = NULL;
    ctxt->start = ctxt->state = xmlRegNewState(ctxt);
    xmlRegStatePush(ctxt, ctxt->start);

    /* parse the expression building an automata */
    xmlFAParseRegExp(ctxt, 1);
    if (CUR != 0) {
	ERROR("xmlFAParseRegExp: extra characters");
    }
    if (ctxt->error != 0) {
	xmlRegFreeParserCtxt(ctxt);
	return(NULL);
    }
    ctxt->end = ctxt->state;
    ctxt->start->type = XML_REGEXP_START_STATE;
    ctxt->end->type = XML_REGEXP_FINAL_STATE;

    /* remove the Epsilon except for counted transitions */
    xmlFAEliminateEpsilonTransitions(ctxt);


    if (ctxt->error != 0) {
	xmlRegFreeParserCtxt(ctxt);
	return(NULL);
    }
    ret = xmlRegEpxFromParse(ctxt);
    xmlRegFreeParserCtxt(ctxt);
    return(ret);
}